

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
deqp::egl::anon_unknown_0::getDamageRegion
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Frame *frame)

{
  int *__args;
  iterator iVar1;
  int iVar2;
  undefined8 in_RAX;
  pointer pDVar3;
  long lVar4;
  ulong uVar5;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar3 = (frame->draws).
           super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((frame->draws).
      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish != pDVar3) {
    lVar4 = 4;
    uVar5 = 0;
    __args = (int *)((long)&uStack_38 + 4);
    uStack_38 = in_RAX;
    do {
      iVar2 = *(int *)((long)(pDVar3->rect).bottomLeft.m_data + lVar4 + -4);
      uStack_38 = CONCAT44(iVar2,(undefined4)uStack_38);
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,iVar1,__args);
      }
      else {
        *iVar1._M_current = iVar2;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar2 = *(int *)((long)(pDVar3->rect).bottomLeft.m_data + lVar4);
      uStack_38 = CONCAT44(iVar2,(undefined4)uStack_38);
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,iVar1,__args);
      }
      else {
        *iVar1._M_current = iVar2;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar2 = *(int *)((long)(pDVar3->rect).bottomLeft.m_data + lVar4 + 4) -
              *(int *)((long)(pDVar3->rect).bottomLeft.m_data + lVar4 + -4);
      uStack_38 = CONCAT44(iVar2,(undefined4)uStack_38);
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,iVar1,__args);
      }
      else {
        *iVar1._M_current = iVar2;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar2 = *(int *)((long)(pDVar3->rect).topRight.m_data + lVar4) -
              *(int *)((long)(pDVar3->rect).bottomLeft.m_data + lVar4);
      uStack_38 = CONCAT44(iVar2,(undefined4)uStack_38);
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,iVar1,__args);
      }
      else {
        *iVar1._M_current = iVar2;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      uVar5 = uVar5 + 1;
      pDVar3 = (frame->draws).
               super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x18;
    } while (uVar5 < (ulong)(((long)(frame->draws).
                                    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar3 >> 3)
                            * -0x5555555555555555));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<EGLint> getDamageRegion (const Frame& frame)
{
	vector<EGLint> damageRegion;
	for (size_t drawNdx = 0; drawNdx < frame.draws.size(); drawNdx++)
	{
		const ColoredRect& rect = frame.draws[drawNdx].rect;
		damageRegion.push_back(rect.bottomLeft.x());
		damageRegion.push_back(rect.bottomLeft.y());
		damageRegion.push_back(rect.topRight.x() - rect.bottomLeft.x());
		damageRegion.push_back(rect.topRight.y() - rect.bottomLeft.y());
	}

	DE_ASSERT(damageRegion.size() % 4 == 0);
	return damageRegion;
}